

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall yy::parser::yy_lac_discard_(parser *this,char *event)

{
  ostream *poVar1;
  size_t sVar2;
  char local_19;
  
  if (this->yy_lac_established_ == true) {
    if (this->yydebug_ != 0) {
      poVar1 = this->yycdebug_;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"LAC: initial context discarded due to ",0x26);
      if (event == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
      }
      else {
        sVar2 = strlen(event);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,event,sVar2);
      }
      local_19 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
    }
    this->yy_lac_established_ = false;
  }
  return;
}

Assistant:

void
  parser::yy_lac_discard_ (const char* event)
  {
   /* Discard any previous initial lookahead context because of Event,
      which may be a lookahead change or an invalidation of the currently
      established initial context for the current lookahead.

      The most common example of a lookahead change is a shift.  An example
      of both cases is syntax error recovery.  That is, a syntax error
      occurs when the lookahead is syntactically erroneous for the
      currently established initial context, so error recovery manipulates
      the parser stacks to try to find a new initial context in which the
      current lookahead is syntactically acceptable.  If it fails to find
      such a context, it discards the lookahead.  */
    if (yy_lac_established_)
      {
        YYCDEBUG << "LAC: initial context discarded due to "
                 << event << '\n';
        yy_lac_established_ = false;
      }
  }